

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void * tommy_hashlin_remove(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  tommy_hashlin_node **list;
  long in_FS_OFFSET;
  tommy_node *local_48;
  tommy_hashlin_node *node;
  tommy_hashlin_node **let_ptr;
  tommy_hash_t hash_local;
  void *cmp_arg_local;
  undefined1 *cmp_local;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  list = tommy_hashlin_bucket_ref(hashlin,hash);
  local_48 = *list;
  do {
    if (local_48 == (tommy_node *)0x0) {
      hashlin_local = (tommy_hashlin *)0x0;
LAB_00118275:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return hashlin_local;
      }
      __stack_chk_fail();
    }
    if (local_48->key == hash) {
      iVar2 = (*(code *)cmp)(cmp_arg,local_48->data);
      if (iVar2 == 0) {
        tommy_list_remove_existing(list,local_48);
        hashlin->count = hashlin->count - 1;
        hashlin_shrink_step(hashlin);
        hashlin_local = (tommy_hashlin *)local_48->data;
        goto LAB_00118275;
      }
    }
    local_48 = local_48->next;
  } while( true );
}

Assistant:

void* tommy_hashlin_remove(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node** let_ptr = tommy_hashlin_bucket_ref(hashlin, hash);
	tommy_hashlin_node* node = *let_ptr;

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(let_ptr, node);

			--hashlin->count;

			hashlin_shrink_step(hashlin);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}